

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O2

void TypeCheck_Block(KonohaContext *kctx,KonohaStack *sfp)

{
  int iVar1;
  kNode *node;
  KClass *reqc;
  _func_void_char_ptr_char_ptr_int_char_ptr_varargs *p_Var2;
  _func_uintptr_t_KonohaContext_ptr_kObject_ptr *p_Var3;
  ktypeattr_t kVar4;
  kNameSpace *ns;
  kString *pkVar5;
  uintptr_t uVar6;
  kNode *pkVar7;
  size_t n;
  size_t sVar8;
  uint uVar9;
  
  node = sfp[1].field_0.asNode;
  ns = kNode_GetNameSpace(kctx,node);
  reqc = ((sfp[3].field_0.asObject)->h).ct;
  n = 0;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"TypeCheck_Block",0x6d,"tracing..");
  if (((((node->field_5).NodeList)->h).ct)->baseTypeId == 6) {
    uVar9 = (int)(((node->field_5).NodeList)->bytesize >> 3) - 1;
  }
  else {
    uVar9 = 0xffffffff;
  }
  kVar4 = reqc->typeId;
  (*kctx->klib->DumpObject)
            (kctx,(kObject_conflict *)node,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
             ,"TypeCheckBlock",0xf6);
  p_Var2 = (kctx->platApi->ConsoleModule).ReportDebugMessage;
  sVar8 = (ns->genv->localScope).varsize;
  pkVar5 = (*kctx->klib->KClass_shortName)(kctx,reqc);
  p_Var3 = ((pkVar5->h).ct)->unbox;
  pkVar5 = (*kctx->klib->KClass_shortName)(kctx,reqc);
  uVar6 = (*p_Var3)(kctx,(kObject_conflict *)pkVar5);
  (*p_Var2)("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
            ,"TypeCheckBlock",0xf7,">>>>>>>> size=%d, varsize=%d, reqc=%s",(ulong)uVar9,sVar8,uVar6)
  ;
  sVar8 = 0;
  if (0 < (int)uVar9) {
    sVar8 = (size_t)uVar9;
  }
  do {
    if (sVar8 == n) {
      if ((int)uVar9 < 0) {
        kVar4 = 0;
        if (node->nodeType != 0x18) {
LAB_00113efd:
          node->nodeType = 0xd;
          node->typeAttr = kVar4;
        }
      }
      else {
        pkVar7 = TypeCheckNodeList(kctx,node,(ulong)uVar9,ns,reqc);
        if (pkVar7->nodeType == 0x18) {
          if (kVar4 == 0) {
            iVar1 = node->nodeType;
            goto joined_r0x00113ec8;
          }
          break;
        }
        if (node->nodeType != 0x18) {
          kVar4 = pkVar7->typeAttr;
          goto LAB_00113efd;
        }
      }
      p_Var2 = (kctx->platApi->ConsoleModule).ReportDebugMessage;
      pkVar5 = KType_GetString(kctx,node->typeAttr & 0xfffffff);
      p_Var3 = ((pkVar5->h).ct)->unbox;
      pkVar5 = KType_GetString(kctx,node->typeAttr & 0xfffffff);
      uVar6 = (*p_Var3)(kctx,(kObject_conflict *)pkVar5);
      (*p_Var2)("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/typecheck.h"
                ,"TypeCheckBlock",0x109,">>>>>>>> size=%d, typed=%s",(ulong)uVar9,uVar6);
      pkVar7 = node;
      break;
    }
    pkVar7 = TypeCheckNodeList(kctx,node,n,ns,*(kctx->share->classTable).field_1.classItems);
    if ((pkVar7->nodeType == 0x18) && (kVar4 == 0)) {
      iVar1 = node->nodeType;
joined_r0x00113ec8:
      pkVar7 = node;
      if (iVar1 != 0x18) {
        node->nodeType = 0xd;
        node->typeAttr = 0;
      }
      break;
    }
    n = n + 1;
  } while (pkVar7->nodeType != 0x18);
  sfp[-4].field_0.asNode = pkVar7;
  (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
  return;
}

Assistant:

static KMETHOD TypeCheck_Block(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck2(stmt, expr, ns, reqc);
	KReturn(TypeCheckBlock(kctx, expr, ns, reqc));
}